

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

Real __thiscall
amrex::SplineDistFcnElement2d::dist
          (SplineDistFcnElement2d *this,RealVect pt,Real x0,Real x1,Real Dx0,Real Dx1,Real y0,
          Real y1,Real Dy0,Real Dy1,Real *t,RealVect *spt)

{
  double dVar1;
  Real *pRVar2;
  RealVect *in_RDX;
  RealVect *in_RDI;
  Real RVar3;
  double dVar4;
  Real dist;
  RealVect delta;
  RealVect *in_stack_ffffffffffffff68;
  RealVect *in_stack_ffffffffffffff70;
  Real in_stack_ffffffffffffff78;
  Real in_stack_ffffffffffffff80;
  Real in_stack_ffffffffffffff88;
  SplineDistFcnElement2d *in_stack_ffffffffffffff90;
  
  RealVect::RealVect(in_RDI);
  RVar3 = eval(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,(Real)in_stack_ffffffffffffff70,
               (Real)in_stack_ffffffffffffff68);
  pRVar2 = RealVect::operator[](in_RDX,0);
  *pRVar2 = RVar3;
  RVar3 = eval(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,(Real)in_stack_ffffffffffffff70,
               (Real)in_stack_ffffffffffffff68);
  pRVar2 = RealVect::operator[](in_RDX,1);
  *pRVar2 = RVar3;
  amrex::operator-(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pRVar2 = RealVect::operator[]((RealVect *)&stack0xffffffffffffff90,0);
  dVar4 = *pRVar2;
  pRVar2 = RealVect::operator[]((RealVect *)&stack0xffffffffffffff90,0);
  RVar3 = *pRVar2;
  pRVar2 = RealVect::operator[]((RealVect *)&stack0xffffffffffffff90,1);
  dVar1 = *pRVar2;
  pRVar2 = RealVect::operator[]((RealVect *)&stack0xffffffffffffff90,1);
  dVar4 = sqrt(dVar4 * RVar3 + dVar1 * *pRVar2);
  return dVar4;
}

Assistant:

amrex::Real SplineDistFcnElement2d::dist(amrex::RealVect pt,
                           amrex::Real x0, amrex::Real x1,
                           amrex::Real Dx0, amrex::Real Dx1,
                           amrex::Real y0, amrex::Real y1,
                           amrex::Real Dy0, amrex::Real Dy1,
                           amrex::Real& t,
                           amrex::RealVect& spt) const {
  amrex::RealVect delta;
  spt[0] = eval(t, x0, x1, Dx0, Dx1);
  spt[1] = eval(t, y0, y1, Dy0, Dy1);

  delta = spt - pt;

  amrex::Real dist;
  dist = sqrt(delta[0]*delta[0] + delta[1]*delta[1]);

  return dist;
}